

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O0

bool __thiscall cppcms::url_dispatcher::dispatch(url_dispatcher *this,string *url)

{
  bool bVar1;
  uint uVar2;
  _data *p_Var3;
  ulong uVar4;
  size_type sVar5;
  element_type *peVar6;
  undefined8 in_RSI;
  hold_ptr<cppcms::url_dispatcher::_data> *in_RDI;
  application *app;
  char *cmethod;
  string method;
  uint i;
  request *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string local_80 [48];
  application *local_50;
  undefined8 local_48;
  string local_40 [36];
  uint local_1c;
  byte local_1;
  
  std::__cxx11::string::string(local_40);
  local_48 = 0;
  p_Var3 = booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->(in_RDI);
  local_50 = p_Var3->app;
  if ((local_50 == (application *)0x0) ||
     (bVar1 = application::has_context
                        ((application *)
                         CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)), !bVar1)) {
    local_50 = (application *)0x0;
  }
  else {
    application::request((application *)0x3b358c);
    http::request::request_method_abi_cxx11_(in_stack_ffffffffffffff28);
    std::__cxx11::string::operator=(local_40,local_80);
    std::__cxx11::string::~string(local_80);
    local_48 = std::__cxx11::string::c_str();
  }
  local_1c = 0;
  do {
    uVar4 = (ulong)local_1c;
    p_Var3 = booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->(in_RDI);
    sVar5 = std::
            vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
            ::size(&p_Var3->options);
    if (sVar5 <= uVar4) {
      local_1 = 0;
LAB_003b36e8:
      std::__cxx11::string::~string(local_40);
      return (bool)(local_1 & 1);
    }
    p_Var3 = booster::hold_ptr<cppcms::url_dispatcher::_data>::operator->(in_RDI);
    std::
    vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
    ::operator[](&p_Var3->options,(ulong)local_1c);
    peVar6 = std::
             __shared_ptr_access<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x3b367d);
    uVar2 = (*peVar6->_vptr_option[2])(peVar6,in_RSI,local_48,local_50);
    if ((uVar2 & 1) != 0) {
      local_1 = 1;
      goto LAB_003b36e8;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

bool url_dispatcher::dispatch(std::string url)
	{
		unsigned i;
		std::string method;
		char const *cmethod = 0;
		application *app = d->app;
		if(app && app->has_context()) {
			method = app->request().request_method();
			cmethod = method.c_str();
		}
		else {
			app = 0;
		}
		for(i=0;i<d->options.size();i++) {
			if(d->options[i]->dispatch(url,cmethod,app))
				return true;
		}
		return false;
	}